

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  uint uVar1;
  int *gt;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *pvVar2;
  int in_EDI;
  double dVar3;
  int *in_stack_00000018;
  uint32_t *in_stack_00000020;
  float **in_stack_00000028;
  char *in_stack_00000030;
  char *in_stack_00000038;
  HNSWIndex *in_stack_00000040;
  double recall;
  rep duration;
  time_point t1;
  uint32_t i;
  time_point t0;
  HNSWIndex *in_stack_000000d0;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  result;
  rep duration_1;
  time_point t1_1;
  time_point t0_1;
  HNSWIndex hnsw_index;
  L2Distance distance;
  uint32_t ef_construction;
  uint32_t ef_search;
  uint32_t M;
  int K;
  int dim;
  uint32_t num_gts;
  uint32_t num_queries;
  uint32_t num_bases;
  int *gt_data;
  float *query_data;
  float *base_data;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffdbc;
  L2Distance *in_stack_fffffffffffffdc0;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
  *in_stack_fffffffffffffdc8;
  HNSWIndex *in_stack_fffffffffffffdd0;
  size_type in_stack_fffffffffffffdd8;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffdf0;
  int M_00;
  Distance *in_stack_fffffffffffffdf8;
  undefined8 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  HNSWIndex *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe20;
  float *in_stack_fffffffffffffe38;
  undefined8 in_stack_fffffffffffffe40;
  duration<long,_std::ratio<1L,_1000000L>_> in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe60;
  uint32_t in_stack_fffffffffffffe64;
  uint local_184;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  local_170;
  rep local_158;
  duration<long,_std::ratio<1L,_1000L>_> local_150;
  rep local_148;
  undefined8 local_140;
  undefined8 local_138;
  HNSWIndex local_120;
  undefined8 local_58;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  uint local_34;
  uint local_30;
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  *local_28;
  HNSWIndex *local_20;
  void *local_18;
  int local_8;
  int local_4;
  
  M_00 = (int)((ulong)in_stack_fffffffffffffdf0 >> 0x20);
  local_4 = 0;
  if (in_EDI < 4) {
    __assert_fail("argc >= 4 && \"Usage: sift_test dataset_path query_path groundtruth_path index_path\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KinglittleQ[P]hnsw/tests/sift_test.cpp"
                  ,0x1c,"int main(int, char **)");
  }
  local_8 = in_EDI;
  read_fvecs(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  read_fvecs(in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
  read_ivecs((char *)in_stack_fffffffffffffdd0,(int **)in_stack_fffffffffffffdc8,
             (uint32_t *)in_stack_fffffffffffffdc0,
             (int *)CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8));
  if (local_34 != local_30) {
    __assert_fail("num_gts == num_queries && \"#GT must be equal to #queries\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/KinglittleQ[P]hnsw/tests/sift_test.cpp"
                  ,0x20,"int main(int, char **)");
  }
  local_40 = 0x20;
  local_44 = 0x100;
  local_48 = 0x28;
  hnsw::L2Distance::L2Distance
            (in_stack_fffffffffffffdc0,CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8)
            );
  uVar4 = 0x28;
  hnsw::HNSWIndex::HNSWIndex
            (in_stack_fffffffffffffe10,
             (float *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
             (uint32_t)((ulong)in_stack_fffffffffffffe00 >> 0x20),
             (uint32_t)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,M_00,
             in_stack_fffffffffffffe20);
  if (local_8 == 5) {
    hnsw::HNSWIndex::LoadIndex(in_stack_000000d0,(char *)t0.__d.__r);
  }
  else {
    local_138 = std::chrono::_V2::steady_clock::now();
    hnsw::HNSWIndex::Build(in_stack_fffffffffffffdd0);
    local_140 = std::chrono::_V2::steady_clock::now();
    local_158 = (rep)std::chrono::operator-
                               ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_fffffffffffffdc8,
                                (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                 *)in_stack_fffffffffffffdc0);
    local_150.__r =
         (rep)std::chrono::
              duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                        ((duration<long,_std::ratio<1L,_1000000000L>_> *)
                         CONCAT44(in_stack_fffffffffffffdbc,uVar4));
    local_148 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_150);
    printf("HNSW Build time: %ldms\n",local_148);
    uVar1 = hnsw::HNSWIndex::TopLayer(&local_120);
    printf("Top layer: %d\n",(ulong)uVar1);
    printf("Distance calculations: %ld\n",local_58);
    hnsw::HNSWIndex::SaveIndex(in_stack_00000040,in_stack_00000038);
  }
  printf("Searching ...\n");
  hnsw::HNSWIndex::SetEfSearch(&local_120,0x100);
  std::
  allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  ::allocator((allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
               *)0x11374d);
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::vector(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
           (allocator_type *)in_stack_fffffffffffffdd0);
  std::
  allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  ::~allocator((allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                *)0x113773);
  std::chrono::_V2::steady_clock::now();
  for (local_184 = 0; local_184 < local_30; local_184 = local_184 + 1) {
    hnsw::HNSWIndex::Search
              ((HNSWIndex *)in_stack_fffffffffffffe48.__r,
               (uint32_t)((ulong)in_stack_fffffffffffffe40 >> 0x20),in_stack_fffffffffffffe38);
    std::
    vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
    ::operator[](&local_170,(ulong)local_184);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    operator=((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
               *)in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
    std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>::
    ~vector((vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
             *)in_stack_fffffffffffffdd0);
  }
  gt = (int *)std::chrono::_V2::steady_clock::now();
  std::chrono::operator-
            ((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffdc8,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)in_stack_fffffffffffffdc0);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
            ((duration<long,_std::ratio<1L,_1000000000L>_> *)
             CONCAT44(in_stack_fffffffffffffdbc,uVar4));
  pvVar2 = (vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
            *)std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                        ((duration<long,_std::ratio<1L,_1000000L>_> *)&stack0xfffffffffffffe48);
  printf(anon_var_dwarf_acdd,(long)pvVar2 / (long)(ulong)local_30,
         (long)pvVar2 % (long)(ulong)local_30);
  printf("Evaluating ...\n");
  dVar3 = ComputeRecall(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60,gt,pvVar2);
  printf("Recall@100: %f\n",dVar3);
  pvVar2 = local_28;
  if (local_28 !=
      (vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
       *)0x0) {
    operator_delete(local_28);
    pvVar2 = local_28;
  }
  if (local_18 != (void *)0x0) {
    operator_delete(local_18);
  }
  if (local_20 != (HNSWIndex *)0x0) {
    operator_delete(local_20);
  }
  local_4 = 0;
  std::
  vector<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>_>
  ::~vector(pvVar2);
  hnsw::HNSWIndex::~HNSWIndex(local_20);
  hnsw::L2Distance::~L2Distance((L2Distance *)0x1139fa);
  return local_4;
}

Assistant:

int main(int argc, char **argv) {
  float *base_data, *query_data;
  int *gt_data;
  uint32_t num_bases, num_queries, num_gts;
  int dim, K;

  assert(argc >= 4 && "Usage: sift_test dataset_path query_path groundtruth_path index_path");
  read_fvecs(argv[1], base_data, num_bases, dim);
  read_fvecs(argv[2], query_data, num_queries, dim);
  read_ivecs(argv[3], gt_data, num_gts, K);
  assert(num_gts == num_queries && "#GT must be equal to #queries");

  const uint32_t M = 32;
  const uint32_t ef_search = 256;
  const uint32_t ef_construction = 40;

  hnsw::L2Distance distance(dim);
  hnsw::HNSWIndex hnsw_index(base_data, num_bases, dim, distance, M, ef_construction);

  if (argc == 5) {
    hnsw_index.LoadIndex(argv[4]);
  } else {
    // Test build
    auto t0 = steady_clock::now();
    hnsw_index.Build();
    auto t1 = steady_clock::now();
    auto duration = duration_cast<milliseconds>(t1 - t0).count();
    printf("HNSW Build time: %ldms\n", duration);
    printf("Top layer: %d\n", hnsw_index.TopLayer());
    printf("Distance calculations: %ld\n", distance.num);

    hnsw_index.SaveIndex("index.bin");
  }

  printf("Searching ...\n");
  hnsw_index.SetEfSearch(ef_search);
  std::vector<PointSet> result(num_queries);
  auto t0 = steady_clock::now();
  for (uint32_t i = 0; i < num_queries; i++) {
    result[i] = hnsw_index.Search(K, &query_data[i * dim]);
  }
  auto t1 = steady_clock::now();
  auto duration = duration_cast<microseconds>(t1 - t0).count();
  printf("HNSW search speed: %ld µs/query\n", duration / num_queries);

  printf("Evaluating ...\n");
  double recall = ComputeRecall(num_queries, K, gt_data, result);
  printf("Recall@100: %f\n", recall);

  delete gt_data;
  delete base_data;
  delete query_data;

  return 0;
}